

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

Reg __thiscall backend::codegen::Codegen::translate_value_to_reg(Codegen *this,Value *v)

{
  uint32_t num;
  Reg RVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer *__ptr;
  _Head_base<0UL,_arm::Inst_*,_false> local_58;
  Reg rd;
  _Head_base<0UL,_arm::Arith2Inst_*,_false> local_48;
  uint local_3c;
  undefined **local_38;
  Reg local_30;
  undefined2 local_2c;
  VarId local_28;
  
  if (v->field_0x18 == '\x01') {
    local_28.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_28.id = *(uint32_t *)&v->field_0x10;
    rd = get_or_alloc_vgp(this,&local_28);
    if ((v->field_0x18 != '\0') && (v->shift_amount != '\0')) {
      RVar1 = alloc_vgp(this);
      local_3c = 6;
      local_2c._0_1_ = v->shift;
      local_2c._1_1_ = v->shift_amount;
      local_38 = &PTR_display_001db7d0;
      local_30 = rd;
      rd = RVar1;
      std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int&,arm::RegisterOperand>
                ((OpCode *)&local_48,&local_3c,(RegisterOperand *)&rd);
      local_58._M_head_impl = &(local_48._M_head_impl)->super_Inst;
      local_48._M_head_impl = (Arith2Inst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_58)
      ;
      if (local_58._M_head_impl != (Inst *)0x0) {
        (*((local_58._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
      }
      local_58._M_head_impl = (Inst *)0x0;
      std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)&local_48);
    }
  }
  else {
    if (v->field_0x18 != '\0') {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      puVar3 = (undefined8 *)operator_new(8);
      *puVar3 = &PTR__exception_001da1b0;
      *puVar2 = puVar3;
      __cxa_throw(puVar2,&prelude::UnreachableException*::typeinfo,0);
    }
    num = *(uint32_t *)&v->field_0x8;
    RVar1 = alloc_vgp(this);
    make_number(this,RVar1,num);
    rd = RVar1;
  }
  return rd;
}

Assistant:

arm::Reg Codegen::translate_value_to_reg(mir::inst::Value& v) {
  if (auto x = v.get_if<int32_t>()) {
    auto int_value = *x;
    auto reg = alloc_vgp();
    uint32_t imm_u = int_value;
    make_number(reg, imm_u);
    return reg;
  } else if (auto x = v.get_if<mir::inst::VarId>()) {
    auto reg = get_or_alloc_vgp(*x);
    if (v.has_shift()) {
      auto rd = alloc_vgp();
      inst.push_back(std::make_unique<Arith2Inst>(
          OpCode::Mov, rd, RegisterOperand(reg, v.shift, v.shift_amount)));
      return rd;
    } else {
      return reg;
    }
  } else {
    throw new prelude::UnreachableException();
  }
}